

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itread.c
# Opt level: O1

int it_read_instrument(IT_INSTRUMENT *instrument,DUMBFILE *f,int maxlen)

{
  int32 iVar1;
  int iVar2;
  int32 iVar3;
  int iVar4;
  long lVar5;
  
  if (maxlen == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = dumbfile_pos(f);
  }
  dumbfile_skip(f,4);
  dumbfile_getnc((char *)instrument->filename,0xd,f);
  instrument->filename[0xd] = '\0';
  iVar2 = dumbfile_getc(f);
  instrument->new_note_action = (uchar)iVar2;
  iVar2 = dumbfile_getc(f);
  instrument->dup_check_type = (uchar)iVar2;
  iVar2 = dumbfile_getc(f);
  instrument->dup_check_action = (uchar)iVar2;
  iVar2 = dumbfile_igetw(f);
  instrument->fadeout = iVar2;
  iVar2 = dumbfile_getc(f);
  instrument->pp_separation = (char)iVar2;
  iVar2 = dumbfile_getc(f);
  instrument->pp_centre = (uchar)iVar2;
  iVar2 = dumbfile_getc(f);
  instrument->global_volume = (uchar)iVar2;
  iVar2 = dumbfile_getc(f);
  instrument->default_pan = (uchar)iVar2;
  iVar2 = dumbfile_getc(f);
  instrument->random_volume = (uchar)iVar2;
  iVar2 = dumbfile_getc(f);
  instrument->random_pan = (uchar)iVar2;
  dumbfile_skip(f,4);
  dumbfile_getnc((char *)instrument,0x1a,f);
  instrument->name[0x1a] = '\0';
  iVar2 = dumbfile_getc(f);
  instrument->filter_cutoff = (uchar)iVar2;
  iVar2 = dumbfile_getc(f);
  instrument->filter_resonance = (uchar)iVar2;
  dumbfile_skip(f,4);
  lVar5 = -0x78;
  do {
    iVar2 = dumbfile_getc(f);
    *(char *)((long)instrument->map_sample + lVar5 + -1) = (char)iVar2;
    iVar2 = dumbfile_getc(f);
    *(short *)(&instrument->field_0x29a + lVar5 * 2) = (short)iVar2;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0);
  iVar2 = dumbfile_error(f);
  iVar4 = -1;
  if ((((iVar2 == 0) && (iVar2 = it_read_envelope(&instrument->volume_envelope,f), iVar2 == 0)) &&
      (iVar2 = it_read_envelope(&instrument->pan_envelope,f), iVar2 == 0)) &&
     (iVar2 = it_read_envelope(&instrument->pitch_envelope,f), iVar2 == 0)) {
    if ((maxlen != 0) && (iVar3 = dumbfile_pos(f), (iVar1 + maxlen) - iVar3 < 0x7c)) {
      return 0;
    }
    iVar1 = dumbfile_mgetl(f);
    if (iVar1 == 0x5854504d) {
      lVar5 = 0;
      do {
        iVar2 = dumbfile_getc(f);
        instrument->map_sample[lVar5] = instrument->map_sample[lVar5] + (short)(iVar2 << 8);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x78);
      iVar2 = dumbfile_error(f);
      if (iVar2 != 0) {
        return -1;
      }
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int it_read_instrument(IT_INSTRUMENT *instrument, DUMBFILE *f, int maxlen)
{
	int n, len = 0;

	/*if (dumbfile_mgetl(f) != IT_INSTRUMENT_SIGNATURE)
		return -1;*/
	// XXX

	if (maxlen) len = dumbfile_pos(f);

	dumbfile_skip(f, 4);

    dumbfile_getnc((char *)instrument->filename, 13, f);
	instrument->filename[13] = 0;

	instrument->new_note_action = dumbfile_getc(f);
	instrument->dup_check_type = dumbfile_getc(f);
	instrument->dup_check_action = dumbfile_getc(f);
	instrument->fadeout = dumbfile_igetw(f);
	instrument->pp_separation = dumbfile_getc(f);
	instrument->pp_centre = dumbfile_getc(f);
	instrument->global_volume = dumbfile_getc(f);
	instrument->default_pan = dumbfile_getc(f);
	instrument->random_volume = dumbfile_getc(f);
	instrument->random_pan = dumbfile_getc(f);

	/* Skip Tracker Version and Number of Samples. These are only used in
	 * separate instrument files. Also skip unused byte.
	 */
	dumbfile_skip(f, 4);

    dumbfile_getnc((char *)instrument->name, 26, f);
	instrument->name[26] = 0;

	instrument->filter_cutoff = dumbfile_getc(f);
	instrument->filter_resonance = dumbfile_getc(f);

	/* Skip MIDI Channel, Program and Bank. */
	//dumbfile_skip(f, 4);
	/*instrument->output = dumbfile_getc(f);
	if ( instrument->output > 16 ) {
		instrument->output -= 128;
	} else {
		instrument->output = 0;
	}
	dumbfile_skip(f, 3);*/
	dumbfile_skip(f, 4);

	for (n = 0; n < 120; n++) {
		instrument->map_note[n] = dumbfile_getc(f);
		instrument->map_sample[n] = dumbfile_getc(f);
	}

	if (dumbfile_error(f))
		return -1;

	if (it_read_envelope(&instrument->volume_envelope, f)) return -1;
	if (it_read_envelope(&instrument->pan_envelope, f)) return -1;
	if (it_read_envelope(&instrument->pitch_envelope, f)) return -1;

	if (maxlen) {
		len = dumbfile_pos(f) - len;
		if ( maxlen - len < 124 ) return 0;
	}

	if ( dumbfile_mgetl(f) == IT_MPTX_SIGNATURE ) {
		for ( n = 0; n < 120; n++ ) {
			instrument->map_sample[ n ] += dumbfile_getc( f ) << 8;
		}

		if (dumbfile_error(f))
			return -1;
	}

	/*if ( dumbfile_mgetl(f) == IT_INSM_SIGNATURE ) {
		int32 end = dumbfile_igetl(f);
		end += dumbfile_pos(f);
		while ( dumbfile_pos(f) < end ) {
			int chunkid = dumbfile_igetl(f);
			switch ( chunkid ) {
				case DUMB_ID('P','L','U','G'):
					instrument->output = dumbfile_getc(f);
					break;
				default:
					chunkid = chunkid / 0x100 + dumbfile_getc(f) * 0x1000000;
					break;
			}
		}

		if (dumbfile_error(f))
			return -1;
	}*/

	return 0;
}